

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

NeuralNetworkRegressor * __thiscall
CoreML::Specification::NeuralNetworkRegressor::New(NeuralNetworkRegressor *this,Arena *arena)

{
  NeuralNetworkRegressor *this_00;
  
  this_00 = (NeuralNetworkRegressor *)operator_new(0x58);
  NeuralNetworkRegressor(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::NeuralNetworkRegressor>(arena,this_00);
  }
  return this_00;
}

Assistant:

NeuralNetworkRegressor* NeuralNetworkRegressor::New(::google::protobuf::Arena* arena) const {
  NeuralNetworkRegressor* n = new NeuralNetworkRegressor;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}